

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::IfdefGuardPrinter::IfdefGuardPrinter
          (IfdefGuardPrinter *this,Printer *p,string_view filename,
          AnyInvocable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          *make_ifdef_identifier)

{
  basic_string_view<char,_std::char_traits<char>_> args;
  AnyInvocable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_00;
  Printer **ppPVar1;
  Arg *a0;
  string_view format;
  Arg local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  string local_78;
  string_view local_58;
  IfdefGuardPrinter *local_48;
  size_t sStack_40;
  AnyInvocable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_30;
  AnyInvocable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *make_ifdef_identifier_local;
  Printer *p_local;
  IfdefGuardPrinter *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (IfdefGuardPrinter *)filename._M_len;
  a0 = (Arg *)make_ifdef_identifier;
  local_30 = make_ifdef_identifier;
  make_ifdef_identifier_local =
       (AnyInvocable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
        *)p;
  p_local = (Printer *)this;
  ppPVar1 = absl::lts_20240722::log_internal::DieIfNull<google::protobuf::io::Printer*const&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/ifndef_guard.cc"
                       ,0x2f,"p",(Printer **)&make_ifdef_identifier_local);
  this->p_ = *ppPVar1;
  local_48 = this_local;
  sStack_40 = filename_local._M_len;
  args._M_str = (char *)filename_local._M_len;
  args._M_len = (size_t)this_local;
  absl::lts_20240722::internal_any_invocable::
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(&this->ifdef_identifier_,
               &make_ifdef_identifier->
                super_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               ,args);
  this_00 = make_ifdef_identifier_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"#ifndef $0\n#define $0\n\n");
  absl::lts_20240722::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_b8,&this->ifdef_identifier_);
  format._M_str = (char *)&local_b8;
  format._M_len = (size_t)local_88._M_str;
  absl::lts_20240722::Substitute_abi_cxx11_(&local_78,(lts_20240722 *)local_88._M_len,format,a0);
  local_58 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_78);
  io::Printer::Print<>((Printer *)this_00,local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

IfdefGuardPrinter::IfdefGuardPrinter(
    google::protobuf::io::Printer* const p, const absl::string_view filename,
    absl::AnyInvocable<std::string(absl::string_view)> make_ifdef_identifier)
    : p_(ABSL_DIE_IF_NULL(p)),
      ifdef_identifier_(make_ifdef_identifier(filename)) {
  // We can't use variable substitution, because we don't know what delimiter
  // to use.
  p->Print(absl::Substitute(
      R"(#ifndef $0
#define $0

)",
      ifdef_identifier_));
}